

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O0

int coda_expression_eval_void(coda_expression *expr,coda_cursor_conflict *cursor)

{
  undefined1 local_360 [8];
  eval_info info;
  coda_cursor_conflict *cursor_local;
  coda_expression *expr_local;
  
  info.variable_name = (char *)cursor;
  if (expr->result_type == coda_expression_void) {
    if ((cursor == (coda_cursor_conflict *)0x0) && (expr->is_constant == 0)) {
      coda_set_error(-100,"cursor argument may not be NULL if expression is not constant");
      expr_local._4_4_ = -1;
    }
    else {
      init_eval_info((eval_info *)local_360,cursor);
      expr_local._4_4_ = eval_void((eval_info *)local_360,expr);
    }
  }
  else {
    coda_set_error(-100,"expression is not a \'void\' expression");
    expr_local._4_4_ = -1;
  }
  return expr_local._4_4_;
}

Assistant:

int coda_expression_eval_void(const coda_expression *expr, const coda_cursor *cursor)
{
    eval_info info;

    if (expr->result_type != coda_expression_void)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "expression is not a 'void' expression");
        return -1;
    }
    if (cursor == NULL && !expr->is_constant)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument may not be NULL if expression is not constant");
        return -1;
    }

    init_eval_info(&info, cursor);
    return eval_void(&info, expr);
}